

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O0

void __thiscall SignalSwitcher::SignalSwitcher(SignalSwitcher *this)

{
  __sighandler_t p_Var1;
  undefined8 *in_RDI;
  
  if (handle_is_locked) {
    *(undefined1 *)(in_RDI + 1) = 0;
  }
  else {
    handle_is_locked = true;
    interrupt_switch = false;
    p_Var1 = signal(2,set_interrup_global_variable);
    *in_RDI = p_Var1;
    *(undefined1 *)(in_RDI + 1) = 1;
  }
  return;
}

Assistant:

SignalSwitcher::SignalSwitcher()
{
    #pragma omp critical
    {
        if (!handle_is_locked)
        {
            handle_is_locked = true;
            interrupt_switch = false;
            this->old_sig = signal(SIGINT, set_interrup_global_variable);
            this->is_active = true;
        }

        else {
            this->is_active = false;
        }
    }
}